

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTreeCacheFriendly
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  int startNodeIndex;
  cbtBvhSubtreeInfo *pcVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (this->m_SubtreeHeaders).m_size; lVar3 = lVar3 + 1) {
    pcVar1 = (this->m_SubtreeHeaders).m_data;
    uVar2 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,
                       (unsigned_short *)((long)pcVar1->m_quantizedAabbMin + lVar4),
                       (unsigned_short *)((long)pcVar1->m_quantizedAabbMax + lVar4));
    if (uVar2 != 0) {
      startNodeIndex = *(int *)((long)pcVar1->m_quantizedAabbMax + lVar4 + 6);
      walkStacklessQuantizedTree
                (this,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax,startNodeIndex,
                 *(int *)((long)pcVar1->m_padding + lVar4 + -4) + startNodeIndex);
    }
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTreeCacheFriendly(cbtNodeOverlapCallback* nodeCallback, unsigned short int* quantizedQueryAabbMin, unsigned short int* quantizedQueryAabbMax) const
{
	cbtAssert(m_useQuantization);

	int i;

	for (i = 0; i < this->m_SubtreeHeaders.size(); i++)
	{
		const cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders[i];

		//PCK: unsigned instead of bool
		unsigned overlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, subtree.m_quantizedAabbMin, subtree.m_quantizedAabbMax);
		if (overlap != 0)
		{
			walkStacklessQuantizedTree(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax,
									   subtree.m_rootNodeIndex,
									   subtree.m_rootNodeIndex + subtree.m_subtreeSize);
		}
	}
}